

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dry-comparisons.hpp
# Opt level: O3

basic_ostream<char,_std::char_traits<char>_> * __thiscall
rollbear::internal::logical_tuple<int,int,int>::print<char,std::char_traits<char>>
          (logical_tuple<int,int,int> *this,char *label,
          basic_ostream<char,_std::char_traits<char>_> *os)

{
  size_t sVar1;
  ostream *poVar2;
  char local_22 [2];
  basic_ostream<char,_std::char_traits<char>_> *local_20;
  
  if (label == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar1 = strlen(label);
    std::__ostream_insert<char,std::char_traits<char>>(os,label,sVar1);
  }
  local_22[0] = '{';
  std::__ostream_insert<char,std::char_traits<char>>(os,local_22,1);
  local_20 = os;
  std::
  __invoke_impl<void,rollbear::internal::logical_tuple<int,int,int>::print<char,std::char_traits<char>>(char_const*,std::ostream&)const::_lambda((auto:1_const&)___)_1_,int_const&,int_const&,int_const&>
            (&local_20,this + 8,this + 4,this);
  local_22[1] = 0x7d;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,local_22 + 1,1);
  return poVar2;
}

Assistant:

std::basic_ostream<Char, Traits>& print(const Char* label, std::basic_ostream<Char, Traits>& os) const
    {
        os << label << '{';
        std::apply([&os](const auto& ... v) {
            int first = 1;
            ((os << &","[std::exchange(first, 0)] << v),...);
        }, self());
        return os << '}';
    }